

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

Quat * __thiscall rw::Quat::rotate(Quat *this,V3d *axis,float32 angle,CombineOp op)

{
  Quat *p;
  Quat *q;
  float fVar1;
  Quat QVar2;
  Quat rot;
  Quat local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  float local_28;
  
  local_28 = cosf((float)angle * 0.5);
  fVar1 = (float)axis->z * (float)axis->z +
          (float)axis->x * (float)axis->x + (float)axis->y * (float)axis->y;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_48 = ZEXT416((uint)((float)axis->x * fVar1));
  local_58 = ZEXT416((uint)((float)axis->y * fVar1));
  local_38 = ZEXT416((uint)(fVar1 * (float)axis->z));
  local_68.z = (float32)sinf((float)angle * 0.5);
  local_68.x = (float32)((float)local_48._0_4_ * (float)local_68.z);
  local_68.y = (float32)((float)local_58._0_4_ * (float)local_68.z);
  local_68.z = (float32)((float)local_38._0_4_ * (float)local_68.z);
  local_68.w = (float32)local_28;
  if (op == COMBINEPOSTCONCAT) {
    q = &local_68;
    p = this;
  }
  else {
    if (op != COMBINEPRECONCAT) {
      if (op != COMBINEREPLACE) {
        return this;
      }
      this->x = local_68.x;
      this->y = local_68.y;
      this->z = local_68.z;
      this->w = (float32)local_28;
      return this;
    }
    p = &local_68;
    q = this;
  }
  QVar2 = mult(q,p);
  *this = QVar2;
  return this;
}

Assistant:

Quat*
Quat::rotate(const V3d *axis, float32 angle, CombineOp op)
{
	Quat rot = rotation(angle, *axis);
	switch(op){
	case COMBINEREPLACE:
		*this = rot;
		break;
	case COMBINEPRECONCAT:
		*this = mult(*this, rot);
		break;
	case COMBINEPOSTCONCAT:
		*this = mult(rot, *this);
		break;
	}
	return this;
}